

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_map_iterator_next
                  (JSContext *ctx,JSValue this_val,int argc,JSValue *argv,BOOL *pdone,int magic)

{
  int iVar1;
  long *plVar2;
  int *piVar3;
  JSRuntime *pJVar4;
  long lVar5;
  JSValueUnion JVar6;
  JSValue JVar7;
  undefined1 auVar8 [16];
  long *plVar9;
  JSValueUnion *pJVar10;
  long lVar11;
  ulong uVar12;
  JSValue v;
  JSValue JVar13;
  JSValue JVar14;
  JSValueUnion local_58;
  long lStack_50;
  JSValueUnion local_48;
  JSValueUnion JStack_40;
  
  if ((((int)this_val.tag == -1) && (magic + 0x23U == (uint)*(ushort *)((long)this_val.u.ptr + 6)))
     && (plVar2 = *(long **)((long)this_val.u.ptr + 0x30), plVar2 != (long *)0x0)) {
    if ((int)plVar2[1] != 3) {
      if (((int)plVar2[1] == -1) && (magic + 0x1fU == (uint)*(ushort *)(*plVar2 + 6))) {
        lVar11 = *(long *)(*plVar2 + 0x30);
      }
      else {
        lVar11 = 0;
      }
      piVar3 = (int *)plVar2[3];
      if (piVar3 == (int *)0x0) {
        plVar9 = *(long **)(lVar11 + 0x10);
      }
      else {
        plVar9 = *(long **)(piVar3 + 8);
        pJVar4 = ctx->rt;
        *piVar3 = *piVar3 + -1;
        if (*piVar3 == 0) {
          lVar5 = *(long *)(piVar3 + 6);
          *(long **)(lVar5 + 8) = plVar9;
          *plVar9 = lVar5;
          piVar3[6] = 0;
          piVar3[7] = 0;
          piVar3[8] = 0;
          piVar3[9] = 0;
          (*(pJVar4->mf).js_free)(&pJVar4->malloc_state,piVar3);
        }
      }
      for (; plVar9 != (long *)(lVar11 + 8); plVar9 = (long *)plVar9[1]) {
        if (*(int *)((long)plVar9 + -0x14) == 0) {
          *(int *)(plVar9 + -3) = (int)plVar9[-3] + 1;
          plVar2[3] = (long)(plVar9 + -3);
          *pdone = 0;
          if ((int)plVar2[2] == 0) {
            local_48 = (JSValueUnion)((JSValueUnion *)(plVar9 + 4))->ptr;
            JStack_40 = *(JSValueUnion *)(plVar9 + 5);
LAB_00145afb:
            JVar7.tag = (int64_t)JStack_40.ptr;
            JVar7.u.ptr = local_48.ptr;
            JVar14.tag = (int64_t)JStack_40.ptr;
            JVar14.u.ptr = local_48.ptr;
            if (0xfffffff4 < (uint)JStack_40.int32) {
              *(int *)local_48.ptr = *local_48.ptr + 1;
              JVar14 = JVar7;
            }
          }
          else {
            local_58 = *(JSValueUnion *)(plVar9 + 4);
            lStack_50 = plVar9[5];
            pJVar10 = (JSValueUnion *)(plVar9 + 6);
            if (magic != 0) {
              pJVar10 = (JSValueUnion *)(plVar9 + 4);
            }
            local_48 = (JSValueUnion)pJVar10->ptr;
            JStack_40 = pJVar10[1];
            if ((int)plVar2[2] == 1) goto LAB_00145afb;
            JVar14 = js_create_array(ctx,2,(JSValue *)&local_58);
          }
          uVar12 = (ulong)JVar14.u.ptr & 0xffffffff00000000;
          goto LAB_00145a8a;
        }
      }
      plVar2[3] = 0;
      lVar11 = plVar2[1];
      if (0xfffffff4 < (uint)lVar11) {
        JVar6.ptr = (void *)*plVar2;
        iVar1 = *JVar6.ptr;
        *(int *)JVar6.ptr = iVar1 + -1;
        if (iVar1 < 2) {
          v.tag = lVar11;
          v.u.ptr = JVar6.ptr;
          __JS_FreeValueRT(ctx->rt,v);
        }
      }
      *(undefined4 *)plVar2 = 0;
      plVar2[1] = 3;
    }
    *pdone = 1;
    uVar12 = 3;
  }
  else {
    JS_ThrowTypeErrorInvalidClass(ctx,magic + 0x23U);
    *pdone = 0;
    uVar12 = 6;
  }
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar12;
  JVar14 = (JSValue)(auVar8 << 0x40);
  uVar12 = 0;
LAB_00145a8a:
  JVar13.tag = JVar14.tag;
  JVar13.u.ptr = (void *)((ulong)JVar14.u.ptr & 0xffffffff | uVar12);
  return JVar13;
}

Assistant:

static JSValue js_map_iterator_next(JSContext *ctx, JSValueConst this_val,
                                    int argc, JSValueConst *argv,
                                    BOOL *pdone, int magic)
{
    JSMapIteratorData *it;
    JSMapState *s;
    JSMapRecord *mr;
    struct list_head *el;

    it = JS_GetOpaque2(ctx, this_val, JS_CLASS_MAP_ITERATOR + magic);
    if (!it) {
        *pdone = FALSE;
        return JS_EXCEPTION;
    }
    if (JS_IsUndefined(it->obj))
        goto done;
    s = JS_GetOpaque(it->obj, JS_CLASS_MAP + magic);
    assert(s != NULL);
    if (!it->cur_record) {
        el = s->records.next;
    } else {
        mr = it->cur_record;
        el = mr->link.next;
        map_decref_record(ctx->rt, mr); /* the record can be freed here */
    }
    for(;;) {
        if (el == &s->records) {
            /* no more record  */
            it->cur_record = NULL;
            JS_FreeValue(ctx, it->obj);
            it->obj = JS_UNDEFINED;
        done:
            /* end of enumeration */
            *pdone = TRUE;
            return JS_UNDEFINED;
        }
        mr = list_entry(el, JSMapRecord, link);
        if (!mr->empty)
            break;
        /* get the next record */
        el = mr->link.next;
    }

    /* lock the record so that it won't be freed */
    mr->ref_count++;
    it->cur_record = mr;
    *pdone = FALSE;

    if (it->kind == JS_ITERATOR_KIND_KEY) {
        return JS_DupValue(ctx, mr->key);
    } else {
        JSValueConst args[2];
        args[0] = mr->key;
        if (magic)
            args[1] = mr->key;
        else
            args[1] = mr->value;
        if (it->kind == JS_ITERATOR_KIND_VALUE) {
            return JS_DupValue(ctx, args[1]);
        } else {
            return js_create_array(ctx, 2, args);
        }
    }
}